

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O1

void __thiscall
adios2::format::BP5Deserializer::BP5Deserializer
          (BP5Deserializer *this,bool WriterIsRowMajor,bool ReaderIsRowMajor,bool RandomAccessMode,
          bool FlattenSteps)

{
  undefined8 uVar1;
  FFSContext p_Var2;
  
  BP5Base::BP5Base((BP5Base *)&this->field_0x178);
  this->_vptr_BP5Deserializer = (_func_int **)&VTT;
  this->m_WriterIsRowMajor = WriterIsRowMajor;
  this->m_ReaderIsRowMajor = ReaderIsRowMajor;
  this->m_Engine = (Engine *)0x0;
  (this->PendingGetRequests).
  super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PendingGetRequests).
  super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->PendingGetRequests).
  super__Vector_base<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_VarCount = 0;
  this->m_RandomAccessMode = RandomAccessMode;
  this->m_FlattenSteps = FlattenSteps;
  (this->m_WriterCohortSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_WriterCohortSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_WriterCohortSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_LastAttrStep = 0xffffffffffffffff;
  (this->VarByName)._M_h._M_buckets = &(this->VarByName)._M_h._M_single_bucket;
  (this->VarByName)._M_h._M_bucket_count = 1;
  (this->VarByName)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->VarByName)._M_h._M_element_count = 0;
  (this->VarByName)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->VarByName)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->VarByName)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->VarByKey)._M_h._M_buckets = &(this->VarByKey)._M_h._M_single_bucket;
  (this->VarByKey)._M_h._M_bucket_count = 1;
  (this->VarByKey)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->VarByKey)._M_h._M_element_count = 0;
  (this->VarByKey)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->VarByKey)._M_h._M_rehash_policy._M_next_resize,0,0xa8);
  uVar1 = create_local_FMcontext();
  set_ignore_default_values_FMcontext(uVar1);
  p_Var2 = (FFSContext)create_FFSContext_FM(uVar1);
  this->ReaderFFSContext = p_Var2;
  free_FMcontext(uVar1);
  return;
}

Assistant:

BP5Deserializer::BP5Deserializer(bool WriterIsRowMajor, bool ReaderIsRowMajor,
                                 bool RandomAccessMode, bool FlattenSteps)
: m_WriterIsRowMajor{WriterIsRowMajor}, m_ReaderIsRowMajor{ReaderIsRowMajor},
  m_RandomAccessMode{RandomAccessMode}, m_FlattenSteps{FlattenSteps}
{
    FMContext Tmp = create_local_FMcontext();
    set_ignore_default_values_FMcontext(Tmp);
    ReaderFFSContext = create_FFSContext_FM(Tmp);
    free_FMcontext(Tmp);
}